

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageCase1::Cleanup(AdvancedUsageCase1 *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  iVar1 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.m_context
            )->m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.m_context
            )->m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glViewport
            (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar1) + 4));
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers(this_00,3,this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vertex_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_rt);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(3, m_storage_buffer);
		glDeleteBuffers(1, &m_vertex_buffer);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteFramebuffers(1, &m_fbo);
		glDeleteTextures(1, &m_rt);
		return NO_ERROR;
	}